

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

failure<toml::error_info> * toml::err<toml::error_info_const&>(error_info *v)

{
  value_type *in_RDI;
  value_type *this;
  error_info *in_stack_ffffffffffffffa8;
  error_info *in_stack_ffffffffffffffb0;
  
  this = in_RDI;
  error_info::error_info(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  failure<toml::error_info>::failure((failure<toml::error_info> *)this,in_RDI);
  error_info::~error_info(this);
  return (failure<toml::error_info> *)this;
}

Assistant:

failure<typename std::decay<T>::type> err(T&& v)
{
    return failure<typename std::decay<T>::type>(std::forward<T>(v));
}